

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O2

void __thiscall vox::nGRP::nGRP(nGRP *this,int32_t vCount)

{
  ulong in_RAX;
  pointer piVar1;
  pointer piVar2;
  undefined8 uStack_28;
  
  (this->nodeAttribs).keys.super__Vector_base<vox::DICTitem,_std::allocator<vox::DICTitem>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nodeAttribs).keys.super__Vector_base<vox::DICTitem,_std::allocator<vox::DICTitem>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodeAttribs).keys.super__Vector_base<vox::DICTitem,_std::allocator<vox::DICTitem>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodeAttribs).count = 0;
  (this->childNodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->childNodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->childNodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->nodeId = 0;
  this->nodeChildrenNodes = vCount;
  piVar1 = (pointer)0x0;
  piVar2 = (pointer)0x0;
  uStack_28 = in_RAX;
  while ((int)((ulong)((long)piVar2 - (long)piVar1) >> 2) < vCount) {
    uStack_28 = uStack_28 & 0xffffffff;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&this->childNodes,(int *)((long)&uStack_28 + 4));
    piVar1 = (this->childNodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    vCount = this->nodeChildrenNodes;
    piVar2 = (this->childNodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  return;
}

Assistant:

nGRP::nGRP(int32_t vCount) {
    nodeId            = 0;
    nodeChildrenNodes = vCount;
    while ((int32_t)childNodes.size() < nodeChildrenNodes)
        childNodes.push_back(0);
}